

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O3

string * __thiscall
ApprovalTests::Grid::print_abi_cxx11_
          (string *__return_storage_ptr__,Grid *this,int width,int height,
          function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *printCell)

{
  string *psVar1;
  undefined4 in_register_0000000c;
  long lVar2;
  int iVar3;
  int iVar4;
  stringstream s;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  lVar2 = CONCAT44(in_register_0000000c,height);
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_1c8 = width;
  if (0 < width) {
    iVar4 = 0;
    do {
      if (0 < (int)this) {
        iVar3 = 0;
        do {
          local_1cc = iVar3;
          local_1c4 = iVar4;
          if (*(long *)(lVar2 + 0x10) == 0) {
            ::std::__throw_bad_function_call();
          }
          (**(code **)(lVar2 + 0x18))(lVar2,&local_1cc,&local_1c4,(ostream *)local_1a8);
          iVar3 = iVar3 + 1;
        } while ((int)this != iVar3);
      }
      local_1cc = CONCAT31(local_1cc._1_3_,10);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)&local_1cc,1);
      iVar4 = iVar4 + 1;
    } while (iVar4 != local_1c8);
  }
  psVar1 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

std::string Grid::print(int width,
                            int height,
                            std::function<void(int, int, std::ostream&)> printCell)
    {
        std::stringstream s;
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                printCell(x, y, s);
            }
            s << '\n';
        }
        return s.str();
    }